

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O3

void __thiscall Minefield::unflag(Minefield *this,int x,int y)

{
  ulong *puVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *this_00;
  int iVar4;
  
  checkPos(this,x,y);
  checkRunning(this);
  bVar3 = isOpen(this,x,y);
  if (!bVar3) {
    bVar3 = isFlagged(this,x,y);
    if (bVar3) {
      iVar4 = y + 0x3f;
      if (-1 < y) {
        iVar4 = y;
      }
      bVar2 = (byte)y & 0x3f;
      puVar1 = (ulong *)((long)(iVar4 >> 6) * 8 +
                         *(long *)&(this->flags).
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[x].
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data + -8 +
                        (ulong)(((long)y & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      this->flag_cnt = this->flag_cnt + -1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t remove flag on opened field.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Minefield::unflag(int x, int y) {
    checkPos(x, y);
    checkRunning();

    if (isOpen(x, y)) {
        throw std::runtime_error("Can't remove flag on opened field.");
    }

    if (isFlagged(x, y)) {
        flags[x][y] = false;
        flag_cnt--;
    }
}